

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_foreach(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int init_referenced;
  int iVar2;
  CTcToken *pCVar3;
  CTcPrsSymtab *symtab;
  CTcPrsNode *coll_expr_00;
  CTPNStmForeachBase *this_00;
  CTPNStmSwitch *enclosing_switch;
  CTPNStm *body;
  int *in_RSI;
  CTcParser *in_RDI;
  CTPNStmEnclosing *old_enclosing;
  long linenum;
  CTcTokFileDesc *file;
  CTPNStmForeach *foreach_stm;
  CTPNStm *body_stm;
  CTcPrsNode *coll_expr;
  CTcPrsNode *iter_expr;
  tcprs_scope_t scope_data;
  int in_stack_ffffffffffffff1c;
  CTcTokenizer *in_stack_ffffffffffffff20;
  CTcTokenizer *in_stack_ffffffffffffff28;
  CTcParser *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  CTcPrsSymtab *iter_expr_00;
  undefined8 in_stack_ffffffffffffff40;
  CTPNStmForeach *this_01;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  textchar_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffffa0;
  CTcParser *in_stack_ffffffffffffffa8;
  tcprs_scope_t local_30;
  int *local_18;
  CTPNStmForeachBase *local_8;
  size_t sVar4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = in_RSI;
  CTcTokenizer::get_last_pos
            (G_tok,(CTcTokFileDesc **)&stack0xffffffffffffffa8,(long *)&stack0xffffffffffffffa0);
  enter_scope(in_RDI,&local_30);
  tVar1 = CTcTokenizer::next(in_stack_ffffffffffffff28);
  if (tVar1 == TOKT_LPAR) {
    CTcTokenizer::next(in_stack_ffffffffffffff28);
  }
  else {
    CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2688e5);
  if ((tVar1 != TOKT_SYM) && (tVar1 != TOKT_LPAR)) {
    if (tVar1 != TOKT_LOCAL) {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      return (CTPNStm *)0x0;
    }
    create_scope_local_symtab(in_stack_ffffffffffffff30);
    tVar1 = CTcTokenizer::next(in_stack_ffffffffffffff28);
    if (tVar1 == TOKT_SYM) {
      pCVar3 = CTcTokenizer::getcur(G_tok);
      CTcToken::get_text(pCVar3);
      pCVar3 = CTcTokenizer::getcur(G_tok);
      sVar4 = CTcToken::get_text_len(pCVar3);
      init_referenced = (int)sVar4;
      alloc_local(in_RDI);
      CTcPrsSymtab::add_local
                ((CTcPrsSymtab *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50,
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
                 iVar2,init_referenced);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
  }
  symtab = (CTcPrsSymtab *)parse_expr((CTcParser *)0x2689cc);
  if (symtab == (CTcPrsSymtab *)0x0) {
    *local_18 = 1;
    return (CTPNStm *)0x0;
  }
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x268a34);
  if (tVar1 == TOKT_SYM) {
    CTcTokenizer::getcur(G_tok);
    iVar2 = CTcToken::text_matches
                      ((CTcToken *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,
                       (size_t)in_stack_ffffffffffffff20);
    if (iVar2 != 0) {
      CTcTokenizer::next(in_stack_ffffffffffffff28);
      goto LAB_00268aed;
    }
  }
  CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x268a87);
  if (tVar1 == TOKT_EOF) {
    return (CTPNStm *)0x0;
  }
  if (tVar1 == TOKT_RPAR) {
    CTcTokenizer::next(in_stack_ffffffffffffff28);
  }
  else {
    if (tVar1 - TOKT_LBRACE < 2) {
      return (CTPNStm *)0x0;
    }
    if (tVar1 == TOKT_SEM) {
      return (CTPNStm *)0x0;
    }
  }
LAB_00268aed:
  coll_expr_00 = parse_expr((CTcParser *)0x268af7);
  if (coll_expr_00 == (CTcPrsNode *)0x0) {
    *local_18 = 1;
    local_8 = (CTPNStmForeachBase *)0x0;
  }
  else {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x268b38);
    if (tVar1 == TOKT_RPAR) {
      CTcTokenizer::next(in_stack_ffffffffffffff28);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
    this_00 = (CTPNStmForeachBase *)CTcPrsAllocObj::operator_new(0x268b6c);
    iter_expr_00 = in_RDI->local_symtab_;
    this_01 = (CTPNStmForeach *)in_RDI->enclosing_stm_;
    alloc_local(in_RDI);
    CTPNStmForeach::CTPNStmForeach
              (this_01,(CTcPrsNode *)iter_expr_00,coll_expr_00,symtab,
               &this_00->super_CTPNStmEnclosing,in_stack_ffffffffffffff1c);
    enclosing_switch = (CTPNStmSwitch *)set_enclosing_stm(in_RDI,&this_00->super_CTPNStmEnclosing);
    body = parse_stm(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,enclosing_switch,
                     in_stack_ffffffffffffff94);
    set_enclosing_stm(in_RDI,(CTPNStmEnclosing *)enclosing_switch);
    if (*local_18 == 0) {
      CTPNStmForeachBase::set_body(this_00,body);
      CTPNStmBase::set_source_pos
                ((CTPNStmBase *)this_00,(CTcTokFileDesc *)in_stack_ffffffffffffffa8,
                 (long)in_stack_ffffffffffffffa0);
      CTPNStmForeachBase::set_has_own_scope
                (this_00,(uint)(in_RDI->local_symtab_ != local_30.local_symtab));
      leave_scope(in_RDI,&local_30);
      local_8 = this_00;
    }
    else {
      local_8 = (CTPNStmForeachBase *)0x0;
    }
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_foreach(int *err)
{
    tcprs_scope_t scope_data;
    CTcPrsNode *iter_expr;
    CTcPrsNode *coll_expr;
    CTPNStm *body_stm;
    CTPNStmForeach *foreach_stm;
    CTcTokFileDesc *file;
    long linenum;
    CTPNStmEnclosing *old_enclosing;

    /* save the current line information for later */
    G_tok->get_last_pos(&file, &linenum);

    /* 
     *   enter a scope, in case we create a local symbol table for local
     *   variables defined within the 'for' statement 
     */
    enter_scope(&scope_data);

    /* parse the open paren */
    if (G_tok->next() == TOKT_LPAR)
    {
        /* skip it */
        G_tok->next();
    }
    else
    {
        /* log an error, and proceed, assuming it was simply left out */
        G_tok->log_error_curtok(TCERR_REQ_FOREACH_LPAR);
    }

    /* we don't have the iterator lvalue or collection expression yet */
    iter_expr = 0;
    coll_expr = 0;

    /* check for 'local' before the iteration variable */
    switch (G_tok->cur())
    {
    case TOKT_LOCAL:
        /* 
         *   if we haven't created our own symbol table local to the 'for'
         *   loop, do so now 
         */
        create_scope_local_symtab();

        /* skip the 'local' keyword and get the local name */
        if (G_tok->next() == TOKT_SYM)
        {
            /* add the local symbol */
            local_symtab_->add_local(G_tok->getcur()->get_text(),
                                     G_tok->getcur()->get_text_len(),
                                     alloc_local(), FALSE, FALSE, FALSE);
        }
        else
        {
            /* log the error */
            G_tok->log_error_curtok(TCERR_LOCAL_REQ_SYM);
        }

        /* go handle the local as the iteration expression */
        goto do_expr;

    case TOKT_LPAR:
    case TOKT_SYM:
    do_expr:
        /* parse the iterator lvalue expression */
        iter_expr = parse_expr();
        if (iter_expr == 0)
        {
            *err = TRUE;
            return 0;
        }
        break;
        
    default:
        /* premature end of the list - log an error and stop */
        G_tok->log_error_curtok(TCERR_MISSING_FOREACH_EXPR);
        return 0;
    }

    /* require the 'in' keyword */
    if (G_tok->cur() != TOKT_SYM || !G_tok->getcur()->text_matches("in", 2))
    {
        /* log an error */
        G_tok->log_error_curtok(TCERR_FOREACH_REQ_IN);

        /* see what we have */
        switch(G_tok->cur())
        {
        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_SEM:
        case TOKT_EOF:
            /* probably end of statement */
            return 0;
            
        case TOKT_RPAR:
            /* 
             *   probably an extra paren in the variable expression - skip
             *   the paren and continue 
             */
            G_tok->next();
            break;

        default:
            /* probably just left out 'in' - continue from here */
            break;
        }
    }
    else
    {
        /* skip the 'in' */
        G_tok->next();
    }

    /* parse the collection expression */
    coll_expr = parse_expr();
    if (coll_expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* make sure we have the close paren */
    if (G_tok->cur() != TOKT_RPAR)
    {
        /* 
         *   log the error, but continue from here on the assumption that
         *   they simply left out the paren 
         */
        G_tok->log_error_curtok(TCERR_REQ_FOREACH_RPAR);
    }
    else
    {
        /* skip the paren */
        G_tok->next();
    }

    /* 
     *   create the "foreach" node, allocating a private local variable
     *   for holding the iterator object 
     */
    foreach_stm = new CTPNStmForeach(iter_expr, coll_expr, 
                                     local_symtab_, enclosing_stm_,
                                     alloc_local());

    /* set the "foreach" node to enclose its body */
    old_enclosing = set_enclosing_stm(foreach_stm);

    /* parse the body of the loop */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the old enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* if that failed, return failure */
    if (*err)
        return 0;

    /* set the body of the 'for' */
    foreach_stm->set_body(body_stm);

    /* set the original statement position in the node */
    foreach_stm->set_source_pos(file, linenum);

    /* set the own-scope flag */
    foreach_stm->set_has_own_scope(local_symtab_ != scope_data.local_symtab);

    /* exit any local scope we created */
    leave_scope(&scope_data);

    /* return the new statement node */
    return foreach_stm;
}